

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_inl.h
# Opt level: O0

char * __thiscall
google::protobuf::internal::ExtensionSet::ParseFieldWithExtensionInfo<std::__cxx11::string>
          (ExtensionSet *this,int number,bool was_packed_on_wire,ExtensionInfo *extension,
          InternalMetadata *metadata,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint32_t uVar2;
  void *pvVar3;
  char *pcVar4;
  internal *this_00;
  LogMessage *pLVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  MessageLite *msg;
  EnumValidityCheck validator;
  undefined4 in_stack_fffffffffffffe8c;
  int in_stack_fffffffffffffe90;
  MessageLite *local_168;
  string *local_160;
  MessageLite *value_16;
  uint32_t tag;
  MessageLite *value_15;
  int size;
  string *value_14;
  int iStack_f0;
  int value_13;
  uint64_t tmp;
  double value_12;
  long lStack_d8;
  float value_11;
  long value_10;
  unsigned_long uStack_c8;
  int value_9;
  unsigned_long value_8;
  int64_t iStack_b8;
  uint value_7;
  int64_t value_6;
  uint64_t val_1;
  uint32_t uStack_a0;
  int32_t value_5;
  uint64_t val;
  uint64_t value_4;
  uint64_t value_3;
  uint64_t value_2;
  uint64_t value_1;
  uint64_t value;
  LogMessage local_60;
  Voidify local_49;
  ParseContext *local_48;
  EnumValidityFuncWithArg *local_40;
  ExtensionSet *local_38;
  char *ptr_local;
  InternalMetadata *metadata_local;
  ExtensionInfo *extension_local;
  bool was_packed_on_wire_local;
  ExtensionSet *pEStack_18;
  int number_local;
  ExtensionSet *this_local;
  
  local_38 = (ExtensionSet *)ptr;
  ptr_local = (char *)metadata;
  metadata_local = (InternalMetadata *)extension;
  extension_local._3_1_ = was_packed_on_wire;
  extension_local._4_4_ = number;
  pEStack_18 = this;
  if (was_packed_on_wire) {
    switch(extension->type) {
    case '\x01':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedDoubleParser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x02':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedFloatParser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x03':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedInt64Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x04':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedUInt64Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x05':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedInt32Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x06':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedFixed64Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\a':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedFixed32Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\b':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedBoolParser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\t':
    case '\n':
    case '\v':
    case '\f':
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set_inl.h"
                 ,0x37);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_60);
      pLVar5 = absl::lts_20250127::log_internal::LogMessage::operator<<
                         (pLVar5,(char (*) [37])"Non-primitive types can\'t be packed.");
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_49,pLVar5);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_60);
    case '\r':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedUInt32Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x0e':
      this_00 = (internal *)
                MutableRawRepeatedField
                          (this,number,extension->type,(bool)(extension->is_packed & 1),
                           extension->descriptor);
      local_48 = (ParseContext *)metadata_local[2].ptr_;
      local_40 = (EnumValidityFuncWithArg *)metadata_local[3].ptr_;
      validator.arg = ptr_local;
      validator.func = local_40;
      pcVar4 = PackedEnumParserArg<std::__cxx11::string,google::protobuf::internal::ExtensionInfo::EnumValidityCheck>
                         (this_00,local_38,(char *)ctx,local_48,validator,
                          (InternalMetadata *)
                          CONCAT44(in_stack_fffffffffffffe8c,extension_local._4_4_),
                          in_stack_fffffffffffffe90);
      return pcVar4;
    case '\x0f':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedSFixed32Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x10':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedSFixed64Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x11':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedSInt32Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    case '\x12':
      pvVar3 = MutableRawRepeatedField
                         (this,number,extension->type,(bool)(extension->is_packed & 1),
                          extension->descriptor);
      pcVar4 = PackedSInt64Parser(pvVar3,(char *)local_38,ctx);
      return pcVar4;
    }
  }
  else {
    switch(extension->type) {
    case '\x01':
      tmp = (uint64_t)UnalignedLoad<double>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetDouble(this,extension_local._4_4_,'\x01',(double)tmp,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddDouble(this,extension_local._4_4_,'\x01',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(double)tmp,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x02':
      value_12._4_4_ = UnalignedLoad<float>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetFloat(this,extension_local._4_4_,'\x02',value_12._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddFloat(this,extension_local._4_4_,'\x02',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_12._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x03':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_2);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x03',value_2,(FieldDescriptor *)metadata_local[4].ptr_
                );
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x03',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_2,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x04':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_4);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x04',value_4,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x04',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_4,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x05':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_1);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x05',(int32_t)value_1,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x05',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(int32_t)value_1,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x06':
      uStack_c8 = UnalignedLoad<unsigned_long>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt64(this,extension_local._4_4_,'\x06',uStack_c8,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt64(this,extension_local._4_4_,'\x06',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),uStack_c8,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\a':
      value_8._4_4_ = UnalignedLoad<unsigned_int>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\a',value_8._4_4_,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\a',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_8._4_4_,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\b':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&val);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetBool(this,extension_local._4_4_,'\b',val != 0,(FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddBool(this,extension_local._4_4_,'\b',
                (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),val != 0,
                (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\t':
    case '\f':
      if ((extension->is_repeated & 1U) == 0) {
        local_160 = MutableString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      else {
        local_160 = AddString_abi_cxx11_(this,number,'\t',extension->descriptor);
      }
      uVar2 = ReadSize((char **)&local_38);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      pcVar4 = EpsCopyInputStream::ReadString
                         (&ctx->super_EpsCopyInputStream,(char *)local_38,uVar2,local_160);
      return pcVar4;
    case '\n':
      if ((extension->is_repeated & 1U) == 0) {
        local_168 = MutableMessage(this,number,'\n',(extension->field_6).message_info.prototype,
                                   extension->descriptor);
      }
      else {
        local_168 = AddMessage(this,number,'\n',(extension->field_6).message_info.prototype,
                               extension->descriptor);
      }
      pcVar4 = ParseContext::ParseGroup
                         (ctx,local_168,(char *)local_38,extension_local._4_4_ * 8 + 3);
      return pcVar4;
    case '\v':
      if ((extension->is_repeated & 1U) == 0) {
        msg = MutableMessage(this,number,'\v',(extension->field_6).message_info.prototype,
                             extension->descriptor);
      }
      else {
        msg = AddMessage(this,number,'\v',(extension->field_6).message_info.prototype,
                         extension->descriptor);
      }
      pcVar4 = ParseContext::ParseMessage(ctx,msg,(char *)local_38);
      return pcVar4;
    case '\r':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,&value_3);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetUInt32(this,extension_local._4_4_,'\r',(uint32_t)value_3,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddUInt32(this,extension_local._4_4_,'\r',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),(uint32_t)value_3,
                  (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x0e':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,(unsigned_long *)&iStack_f0);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      bVar1 = ExtensionInfo::EnumValidityCheck::IsValid
                        ((EnumValidityCheck *)(metadata_local + 2),iStack_f0);
      uVar2 = extension_local._4_4_;
      if (bVar1) {
        if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
          SetEnum(this,extension_local._4_4_,'\x0e',iStack_f0,
                  (FieldDescriptor *)metadata_local[4].ptr_);
        }
        else {
          AddEnum(this,extension_local._4_4_,'\x0e',
                  (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),iStack_f0,
                  (FieldDescriptor *)metadata_local[4].ptr_);
        }
      }
      else {
        s = InternalMetadata::mutable_unknown_fields<std::__cxx11::string>
                      ((InternalMetadata *)ptr_local);
        WriteVarint(uVar2,(long)iStack_f0,s);
      }
      break;
    case '\x0f':
      value_10._4_4_ = UnalignedLoad<int>(ptr);
      local_38 = (ExtensionSet *)((long)&local_38->arena_ + 4);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x0f',value_10._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x0f',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),value_10._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x10':
      lStack_d8 = UnalignedLoad<long>(ptr);
      local_38 = (ExtensionSet *)&local_38->flat_capacity_;
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x10',lStack_d8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x10',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),lStack_d8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x11':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,(unsigned_long *)&uStack_a0);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      val_1._4_4_ = WireFormatLite::ZigZagDecode32(uStack_a0);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt32(this,extension_local._4_4_,'\x11',val_1._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt32(this,extension_local._4_4_,'\x11',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),val_1._4_4_,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      break;
    case '\x12':
      local_38 = (ExtensionSet *)VarintParse<unsigned_long>(ptr,(unsigned_long *)&value_6);
      if (local_38 == (ExtensionSet *)0x0) {
        return (char *)0x0;
      }
      iStack_b8 = WireFormatLite::ZigZagDecode64(value_6);
      if ((metadata_local[1].ptr_ & 0x10000000000) == 0) {
        SetInt64(this,extension_local._4_4_,'\x12',iStack_b8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
      else {
        AddInt64(this,extension_local._4_4_,'\x12',
                 (bool)(*(byte *)((long)&metadata_local[1].ptr_ + 6) & 1),iStack_b8,
                 (FieldDescriptor *)metadata_local[4].ptr_);
      }
    }
  }
  return (char *)local_38;
}

Assistant:

const char* ExtensionSet::ParseFieldWithExtensionInfo(
    int number, bool was_packed_on_wire, const ExtensionInfo& extension,
    InternalMetadata* metadata, const char* ptr, internal::ParseContext* ctx) {
  if (was_packed_on_wire) {
    switch (extension.type) {
#define HANDLE_TYPE(UPPERCASE, CPP_CAMELCASE)                                \
  case WireFormatLite::TYPE_##UPPERCASE:                                     \
    return internal::Packed##CPP_CAMELCASE##Parser(                          \
        MutableRawRepeatedField(number, extension.type, extension.is_packed, \
                                extension.descriptor),                       \
        ptr, ctx);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT32, UInt32);
      HANDLE_TYPE(UINT64, UInt64);
      HANDLE_TYPE(SINT32, SInt32);
      HANDLE_TYPE(SINT64, SInt64);
      HANDLE_TYPE(FIXED32, Fixed32);
      HANDLE_TYPE(FIXED64, Fixed64);
      HANDLE_TYPE(SFIXED32, SFixed32);
      HANDLE_TYPE(SFIXED64, SFixed64);
      HANDLE_TYPE(FLOAT, Float);
      HANDLE_TYPE(DOUBLE, Double);
      HANDLE_TYPE(BOOL, Bool);
#undef HANDLE_TYPE

      case WireFormatLite::TYPE_ENUM:
        return internal::PackedEnumParserArg<T>(
            MutableRawRepeatedField(number, extension.type, extension.is_packed,
                                    extension.descriptor),
            ptr, ctx, extension.enum_validity_check, metadata, number);
      case WireFormatLite::TYPE_STRING:
      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_GROUP:
      case WireFormatLite::TYPE_MESSAGE:
        ABSL_LOG(FATAL) << "Non-primitive types can't be packed.";
        break;
    }
  } else {
    switch (extension.type) {
#define HANDLE_VARINT_TYPE(UPPERCASE, CPP_CAMELCASE)                        \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t value;                                                         \
    ptr = VarintParse(ptr, &value);                                         \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_VARINT_TYPE(INT32, Int32);
      HANDLE_VARINT_TYPE(INT64, Int64);
      HANDLE_VARINT_TYPE(UINT32, UInt32);
      HANDLE_VARINT_TYPE(UINT64, UInt64);
      HANDLE_VARINT_TYPE(BOOL, Bool);
#undef HANDLE_VARINT_TYPE
#define HANDLE_SVARINT_TYPE(UPPERCASE, CPP_CAMELCASE, SIZE)                 \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    uint64_t val;                                                           \
    ptr = VarintParse(ptr, &val);                                           \
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);                                    \
    auto value = WireFormatLite::ZigZagDecode##SIZE(val);                   \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_SVARINT_TYPE(SINT32, Int32, 32);
      HANDLE_SVARINT_TYPE(SINT64, Int64, 64);
#undef HANDLE_SVARINT_TYPE
#define HANDLE_FIXED_TYPE(UPPERCASE, CPP_CAMELCASE, CPPTYPE)                \
  case WireFormatLite::TYPE_##UPPERCASE: {                                  \
    auto value = UnalignedLoad<CPPTYPE>(ptr);                               \
    ptr += sizeof(CPPTYPE);                                                 \
    if (extension.is_repeated) {                                            \
      Add##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE,          \
                         extension.is_packed, value, extension.descriptor); \
    } else {                                                                \
      Set##CPP_CAMELCASE(number, WireFormatLite::TYPE_##UPPERCASE, value,   \
                         extension.descriptor);                             \
    }                                                                       \
  } break

      HANDLE_FIXED_TYPE(FIXED32, UInt32, uint32_t);
      HANDLE_FIXED_TYPE(FIXED64, UInt64, uint64_t);
      HANDLE_FIXED_TYPE(SFIXED32, Int32, int32_t);
      HANDLE_FIXED_TYPE(SFIXED64, Int64, int64_t);
      HANDLE_FIXED_TYPE(FLOAT, Float, float);
      HANDLE_FIXED_TYPE(DOUBLE, Double, double);
#undef HANDLE_FIXED_TYPE

      case WireFormatLite::TYPE_ENUM: {
        uint64_t tmp;
        ptr = VarintParse(ptr, &tmp);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        int value = tmp;

        if (!extension.enum_validity_check.IsValid(value)) {
          WriteVarint(number, value, metadata->mutable_unknown_fields<T>());
        } else if (extension.is_repeated) {
          AddEnum(number, WireFormatLite::TYPE_ENUM, extension.is_packed, value,
                  extension.descriptor);
        } else {
          SetEnum(number, WireFormatLite::TYPE_ENUM, value,
                  extension.descriptor);
        }
        break;
      }

      case WireFormatLite::TYPE_BYTES:
      case WireFormatLite::TYPE_STRING: {
        std::string* value =
            extension.is_repeated
                ? AddString(number, WireFormatLite::TYPE_STRING,
                            extension.descriptor)
                : MutableString(number, WireFormatLite::TYPE_STRING,
                                extension.descriptor);
        int size = ReadSize(&ptr);
        GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
        return ctx->ReadString(ptr, size, value);
      }

      case WireFormatLite::TYPE_GROUP: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_GROUP,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_GROUP,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        uint32_t tag = (number << 3) + WireFormatLite::WIRETYPE_START_GROUP;
        return ctx->ParseGroup(value, ptr, tag);
      }

      case WireFormatLite::TYPE_MESSAGE: {
        MessageLite* value =
            extension.is_repeated
                ? AddMessage(number, WireFormatLite::TYPE_MESSAGE,
                             *extension.message_info.prototype,
                             extension.descriptor)
                : MutableMessage(number, WireFormatLite::TYPE_MESSAGE,
                                 *extension.message_info.prototype,
                                 extension.descriptor);
        return ctx->ParseMessage(value, ptr);
      }
    }
  }
  return ptr;
}